

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void fillRegion(QPainter *painter,QRegion *rgn,QBrush *brush)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  QBrush *pQVar5;
  QBrush *pQVar6;
  QRect *rect;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  QPointF local_80;
  double local_68;
  double local_60;
  double local_58;
  undefined8 local_50;
  double local_48;
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(*(long *)brush + 4) == 0x18) {
    auVar7 = QRegion::boundingRect();
    QPainter::setClipRegion((QRegion *)painter,(ClipOperation)rgn);
    QBrush::texture();
    local_68 = (double)auVar7._0_4_;
    local_60 = (double)auVar7._4_4_;
    local_48 = (double)(((long)auVar7._8_4_ - (long)auVar7._0_4_) + 1);
    local_40 = (double)(((auVar7._8_8_ >> 0x20) - (auVar7._0_8_ >> 0x20)) + 1);
    local_58 = local_68;
    local_50 = local_60;
    QPainter::drawTiledPixmap((QRectF *)painter,(QPixmap *)&local_58,&local_80);
    QPixmap::~QPixmap((QPixmap *)&local_80);
    goto LAB_002fd555;
  }
  lVar3 = QBrush::gradient();
  if (lVar3 == 0) {
LAB_002fd523:
    pQVar5 = (QBrush *)QRegion::begin();
    pQVar6 = (QBrush *)QRegion::end();
    for (; pQVar5 != pQVar6; pQVar5 = pQVar5 + 0x10) {
      QPainter::fillRect((QRect *)painter,pQVar5);
    }
  }
  else {
    QBrush::gradient();
    iVar1 = QGradient::coordinateMode();
    if (iVar1 != 2) {
      QBrush::gradient();
      iVar1 = QGradient::coordinateMode();
      if (iVar1 != 3) goto LAB_002fd523;
    }
    QPainter::save();
    QPainter::setClipRegion((QRegion *)painter,(ClipOperation)rgn);
    plVar4 = (long *)QPainter::device();
    iVar1 = (**(code **)(*plVar4 + 0x20))(plVar4,1);
    plVar4 = (long *)QPainter::device();
    iVar2 = (**(code **)(*plVar4 + 0x20))(plVar4,2);
    local_58 = 0.0;
    local_50 = (double)CONCAT44(iVar2 + -1,iVar1 + -1);
    QPainter::fillRect((QRect *)painter,(QBrush *)&local_58);
    QPainter::restore();
  }
LAB_002fd555:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void fillRegion(QPainter *painter, const QRegion &rgn, const QBrush &brush)
{
    Q_ASSERT(painter);

    if (brush.style() == Qt::TexturePattern) {
        const QRect rect(rgn.boundingRect());
        painter->setClipRegion(rgn);
        painter->drawTiledPixmap(rect, brush.texture(), rect.topLeft());
    } else if (brush.gradient()
               && (brush.gradient()->coordinateMode() == QGradient::ObjectBoundingMode
                   || brush.gradient()->coordinateMode() == QGradient::ObjectMode)) {
        painter->save();
        painter->setClipRegion(rgn);
        painter->fillRect(0, 0, painter->device()->width(), painter->device()->height(), brush);
        painter->restore();
    } else {
        for (const QRect &rect : rgn)
            painter->fillRect(rect, brush);
    }
}